

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::ClipboardReporter::report(ClipboardReporter *this,string *received,string *approved)

{
  bool isWindows;
  string sStack_38;
  
  isWindows = SystemUtils::isWindowsOs();
  getCommandLineFor(&sStack_38,received,approved,isWindows);
  copyToClipboard(&sStack_38);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return true;
}

Assistant:

bool ClipboardReporter::report(std::string received, std::string approved) const
    {
        copyToClipboard(
            getCommandLineFor(received, approved, SystemUtils::isWindowsOs()));
        return true;
    }